

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar1.cpp
# Opt level: O2

void detectAndDisplay(Mat *frame)

{
  undefined8 *puVar1;
  ostream *poVar2;
  int iVar3;
  int in_R8D;
  size_t i;
  ulong uVar4;
  long lVar5;
  size_t i_1;
  bool bVar6;
  bool bVar7;
  _InputArray local_210;
  Matx<double,_4,_1> local_1f8;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> face;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> fist;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> hand;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> left;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  Mat mask;
  Mat frame_gray;
  
  hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  left.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  left.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  left.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::Mat::Mat(&frame_gray);
  cv::Mat::Mat(&mask);
  local_1f8.val[2] = 0.0;
  local_210.sz.width = 0;
  local_210.sz.height = 0;
  local_1f8.val[0]._0_4_ = 0x1010000;
  local_210.flags = 0x2010000;
  local_210.obj = &mask;
  local_1f8.val[1] = (double)frame;
  cv::cvtColor((cv *)&local_1f8,&local_210,(_OutputArray *)0x6,0,in_R8D);
  local_1f8.val[2] = 0.0;
  local_1f8.val[0] = (double)CONCAT44(local_1f8.val[0]._4_4_,0x1010000);
  local_f8 = 0x1e0000001e;
  local_100 = 0;
  local_1f8.val[1] = (double)frame;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,hand_classifier,&local_1f8,&hand,2,2,&local_f8,&local_100);
  iVar3 = 0;
  lVar5 = 0xc;
  uVar4 = 0;
  while( true ) {
    if ((ulong)((long)hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) <= uVar4) break;
    if ((*(int *)((long)hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar5 + -4) < 0xb0) ||
       (*(int *)((long)&(hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start)->x + lVar5) < 0xb0)) {
      iVar3 = iVar3 + 1;
    }
    else {
      local_210.sz.width = 0;
      local_210.sz.height = 0;
      local_210.flags = 0x3010000;
      puVar1 = (undefined8 *)
               ((long)hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar5 + -0xc);
      local_138 = *puVar1;
      uStack_130 = puVar1[1];
      local_210.obj = frame;
      cv::Matx<double,_4,_1>::Matx(&local_1f8);
      local_1f8.val[0] = 255.0;
      local_1f8.val[1] = 255.0;
      local_1f8.val[2] = 255.0;
      local_1f8.val[3] = 0.0;
      cv::rectangle(&local_210,&local_138,&local_1f8,5,8,0);
      poVar2 = std::operator<<((ostream *)outfile,"palm");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x10;
  }
  bVar6 = hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start;
  local_1f8.val[2] = 0.0;
  local_1f8.val[0] = (double)CONCAT44(local_1f8.val[0]._4_4_,0x1010000);
  local_108 = 0x1e0000001e;
  local_110 = 0;
  local_1f8.val[1] = (double)frame;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,fist_classifier,&local_1f8,&fist,2,2,&local_108,&local_110);
  lVar5 = 0xc;
  uVar4 = 0;
  while( true ) {
    if ((ulong)((long)fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) <= uVar4) break;
    if ((0x7d < *(int *)((long)&(fist.
                                 super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->x + lVar5)) &&
       (0x7d < *(int *)((long)fist.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar5 + -4))) {
      local_210.sz.width = 0;
      local_210.sz.height = 0;
      local_210.flags = 0x3010000;
      puVar1 = (undefined8 *)
               ((long)fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar5 + -0xc);
      local_148 = *puVar1;
      uStack_140 = puVar1[1];
      local_210.obj = frame;
      cv::Matx<double,_4,_1>::Matx(&local_1f8);
      local_1f8.val[0] = 255.0;
      local_1f8.val[1] = 255.0;
      local_1f8.val[2] = 255.0;
      local_1f8.val[3] = 0.0;
      cv::rectangle(&local_210,&local_148,&local_1f8,5,8,0);
      poVar2 = std::operator<<((ostream *)outfile,"fist");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x10;
  }
  bVar7 = fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start;
  local_1f8.val[2] = 0.0;
  local_1f8.val[0] = (double)CONCAT44(local_1f8.val[0]._4_4_,0x1010000);
  local_1f8.val[1] = (double)&mask;
  local_118 = 0x1e0000001e;
  local_120 = 0;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,face_classifier,&local_1f8,&face,2,2,&local_118,&local_120);
  lVar5 = 0xc;
  uVar4 = 0;
  while( true ) {
    if ((ulong)((long)face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) <= uVar4) break;
    if ((0x96 < *(int *)((long)&(face.
                                 super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->x + lVar5)) &&
       (0x96 < *(int *)((long)face.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar5 + -4))) {
      local_210.sz.width = 0;
      local_210.sz.height = 0;
      local_210.flags = 0x3010000;
      puVar1 = (undefined8 *)
               ((long)face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar5 + -0xc);
      local_158 = *puVar1;
      uStack_150 = puVar1[1];
      local_210.obj = frame;
      cv::Matx<double,_4,_1>::Matx(&local_1f8);
      local_1f8.val[0] = 255.0;
      local_1f8.val[1] = 255.0;
      local_1f8.val[2] = 0.0;
      local_1f8.val[3] = 0.0;
      cv::rectangle(&local_210,&local_158,&local_1f8,5,8,0);
      poVar2 = std::operator<<((ostream *)outfile,"face");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x10;
  }
  if (iVar3 + (uint)bVar6 + (uint)bVar7 +
      (uint)(face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
             super__Vector_impl_data._M_finish ==
            face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start) == 3) {
    poVar2 = std::operator<<((ostream *)outfile,"none");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  local_1f8.val[2] = 0.0;
  local_1f8.val[0] = (double)CONCAT44(local_1f8.val[0]._4_4_,0x1010000);
  local_1f8.val[1] = (double)frame;
  cv::imshow((string *)&window_name_abi_cxx11_,(_InputArray *)&local_1f8);
  cv::Mat::~Mat(&mask);
  cv::Mat::~Mat(&frame_gray);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            (&left.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            (&face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            (&fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            (&hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
  return;
}

Assistant:

void detectAndDisplay( Mat frame )
{
  int s1 = 0;
  std::vector<Rect> hand;
  std::vector<Rect> fist;
  std::vector<Rect> face;
  std::vector<Rect> left;
  Mat frame_gray,mask;
  //mask = frame;

  //blur(frame,frame,Size(3,3)); 
  cvtColor( frame, mask ,COLOR_BGR2GRAY );
  //equalizeHist( frame, frame_gray );
  //threshold( frame, frame_gray, threshold_value, max_binary_value, threshold_type );
  //threshold(frame,frame_gray,150,180,THRESH_BINARY);
  //adaptiveThreshold(frame, frame_gray, 255 , ADAPTIVE_THRESH_GAUSSIAN_C, THRESH_BINARY ,11,2);
  //imshow( "Window-2", frame_gray );
  hand_classifier.detectMultiScale( frame, hand, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30));

for( size_t i = 0; i < hand.size(); i++ )
{
//Point center(hand[i].x *1.5+ hand[i].width*0.5, hand[i].y*1.5 + hand[i].height*0.5);
//cv::rectangle(frame, hand[i], cv::Scalar(255, 255, 255), 5);
//imshow(window_name,hand[i]);
//cout<<hand[i]<<"\n";
if (hand[i].width>175 && hand[i].height>175)// cout<<"palm"<<"width:  "<<hand[i].width<<"  height: "<<hand[i].height<<"\n";
{
//cout<<"palm"<<"\n";
Point center(hand[i].x *1.5+ hand[i].width*0.5, hand[i].y*1.5 + hand[i].height*0.5);
cv::rectangle(frame, hand[i], cv::Scalar(255, 255, 255), 5);
outfile << "palm" << endl;
}
else s1++;
}

if (hand.size()==0) s1++;

//fist_classifier.detectMultiScale( frame_gray, fist, 1.1, 2, 0|CV_HAAR_SCALE_IMAGE, Size(30, 30) );
fist_classifier.detectMultiScale( frame, fist, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30) );

for ( size_t i = 0; i < fist.size(); i++ )
{
//Point center(fist[i].x *1.5+ fist[i].width*0.5, fist[i].y*1.5 + fist[i].height*0.5);
//cv::rectangle(frame, fist[i], cv::Scalar(255, 255, 255), 5);
//imshow(window_name,fist[i]);
if (fist[i].height>125 && fist[i].width > 125) //cout<<"fist-->height  "<<fist[i].height<<"  fist-->width  "<<fist[i].width <<"\n";
{
//cout<<"fist"<<"\n";
Point center(fist[i].x *1.5+ fist[i].width*0.5, fist[i].y*1.5 + fist[i].height*0.5);
cv::rectangle(frame, fist[i], cv::Scalar(255, 255, 255), 5);
outfile << "fist" << endl;
}
//else s1++;
}

if (fist.size()==0) s1++;

// smile classifier

//smile_classifier.detectMultiScale(frame,smile, 1.7, 22);
face_classifier.detectMultiScale( mask, face, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30));

for (size_t i = 0;i< face.size();i++)
{
//Point center(face[i].x *2.5+ face[i].width*2.5, face[i].y*2.5 + face[i].height*2.5);
if (face[i].height>150 && face[i].width>150)
{
Point center(face[i].x *2.5+ face[i].width*2.5, face[i].y*2.5 + face[i].height*2.5);  
cv::rectangle(frame, face[i], cv::Scalar(255, 255, 0), 5);
//cout<<"smile-->height  "<<face[i].height<<"smile-->width "<<face[i].width <<"\n";
//cout<<"***"<<"face"<<"\n";
outfile << "face" << endl;
}
//else s1++;
//imshow("new-window", frame_gray);
}

if (face.size()==0) s1++;

if (s1 == 3) 
{
  outfile<< "none" << endl;
  //cout<<"none"<<"\n";
}
//cout<<s1<<endl;
imshow( window_name, frame);
}